

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TextEx(char *text,char *text_end,ImGuiTextFlags flags)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ImVec2 text_size;
  ImRect bb;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ImRect local_88;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    if (text == text_end) {
      text_end = "";
      text = "";
    }
    if (text_end == (char *)0x0) {
      sVar5 = strlen(text);
      text_end = text + sVar5;
    }
    local_58 = ZEXT416((uint)(pIVar1->DC).CursorPos.x);
    fVar10 = (pIVar1->DC).TextWrapPos;
    local_68 = ZEXT416((uint)((pIVar1->DC).CursorPos.y + (pIVar1->DC).CurrLineTextBaseOffset));
    if (((long)text_end - (long)text < 0x7d1) || (0.0 <= fVar10)) {
      fVar11 = 0.0;
      if (0.0 <= fVar10) {
        fVar11 = CalcWrapWidthForPos(&(pIVar1->DC).CursorPos,fVar10);
      }
      local_98._0_4_ = fVar11;
      local_a0 = CalcTextSize(text,text_end,false,fVar11);
      local_88.Max.x = (float)local_58._0_4_ + local_a0.x;
      local_88.Max.y = (float)local_68._0_4_ + local_a0.y;
      local_88.Min.x = (float)local_58._0_4_;
      local_88.Min.y = (float)local_68._0_4_;
      ItemSize(&local_a0,0.0);
      bVar4 = ItemAdd(&local_88,0,(ImRect *)0x0,0);
      if (bVar4) {
        IVar2.y = local_88.Min.y;
        IVar2.x = local_88.Min.x;
        RenderTextWrapped(IVar2,text,text_end,(float)local_98._0_4_);
      }
    }
    else {
      local_48 = GetTextLineHeight();
      local_a0.x = 0.0;
      local_a0.y = 0.0;
      local_88.Min.y = (float)local_68._0_4_;
      local_88.Min.x = (float)local_58._0_4_;
      fVar10 = (float)local_68._0_4_;
      uVar12 = local_58._4_4_;
      uVar13 = local_68._4_4_;
      if ((pIVar3->LogEnabled == false) &&
         (iVar7 = (int)(((pIVar1->ClipRect).Min.y - (float)local_68._0_4_) / local_48), 0 < iVar7))
      {
        fVar10 = 0.0;
        if (text < text_end) {
          local_98._4_4_ = local_68._0_4_;
          local_98._0_4_ = local_58._0_4_;
          uStack_90 = local_58._4_4_;
          uStack_8c = local_68._4_4_;
          iVar8 = 0;
          do {
            pcVar6 = (char *)memchr(text,10,(long)text_end - (long)text);
            if (pcVar6 == (char *)0x0) {
              pcVar6 = text_end;
            }
            if ((flags & 1U) == 0) {
              _local_78 = ZEXT416((uint)local_a0.x);
              IVar2 = CalcTextSize(text,pcVar6,false,-1.0);
              uVar9 = -(uint)(IVar2.x <= (float)local_78._0_4_);
              local_a0.x = (float)(uVar9 & local_78._0_4_ | ~uVar9 & (uint)IVar2.x);
            }
            text = pcVar6 + 1;
            iVar8 = iVar8 + 1;
          } while ((text < text_end) && (iVar8 < iVar7));
          fVar10 = (float)iVar8;
          local_88.Min.x = (float)local_98._0_4_;
          uVar12 = uStack_90;
          uVar13 = uStack_8c;
        }
        fVar10 = fVar10 * local_48 + (float)local_68._0_4_;
        local_88.Min.y = (float)local_68._0_4_;
      }
      if (text < text_end) {
        local_88.Max.x = local_88.Min.x + 3.4028235e+38;
        local_88.Max.y = local_48 + fVar10;
        local_98._0_4_ = local_88.Min.x;
        uStack_90 = uVar12;
        uStack_8c = uVar13;
        local_88.Min.y = fVar10;
        do {
          local_98._4_4_ = fVar10;
          bVar4 = IsClippedEx(&local_88,0);
          if (bVar4) {
            fVar10 = (float)local_98._4_4_;
            break;
          }
          pcVar6 = (char *)memchr(text,10,(long)text_end - (long)text);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = text_end;
          }
          _local_78 = ZEXT416((uint)local_a0.x);
          IVar2 = CalcTextSize(text,pcVar6,false,-1.0);
          uVar9 = -(uint)(IVar2.x <= (float)local_78._0_4_);
          local_a0.x = (float)(uVar9 & local_78._0_4_ | ~uVar9 & (uint)IVar2.x);
          RenderText((ImVec2)local_98,text,pcVar6,false);
          text = pcVar6 + 1;
          local_88.Min.y = local_88.Min.y + local_48;
          local_88.Max.y = local_88.Max.y + local_48;
          fVar10 = (float)local_98._4_4_ + local_48;
        } while (text < text_end);
        fVar11 = 0.0;
        if (text < text_end) {
          local_78._4_4_ = fVar10;
          local_78._0_4_ = local_98._0_4_;
          uStack_70 = uStack_90;
          uStack_6c = uStack_8c;
          iVar7 = 0;
          do {
            pcVar6 = (char *)memchr(text,10,(long)text_end - (long)text);
            if (pcVar6 == (char *)0x0) {
              pcVar6 = text_end;
            }
            if ((flags & 1U) == 0) {
              _local_98 = ZEXT416((uint)local_a0.x);
              IVar2 = CalcTextSize(text,pcVar6,false,-1.0);
              uVar9 = -(uint)(IVar2.x <= (float)local_98._0_4_);
              local_a0.x = (float)(uVar9 & local_98._0_4_ | ~uVar9 & (uint)IVar2.x);
            }
            text = pcVar6 + 1;
            iVar7 = iVar7 + 1;
          } while (text < text_end);
          fVar11 = (float)iVar7;
          fVar10 = (float)local_78._4_4_;
        }
        fVar10 = fVar11 * local_48 + fVar10;
        local_88.Min.y = (float)local_68._0_4_;
      }
      local_a0.y = fVar10 - local_88.Min.y;
      local_88.Max.x = local_a0.x + (float)local_58._0_4_;
      local_88.Max.y = (fVar10 - local_88.Min.y) + local_88.Min.y;
      local_88.Min.x = (float)local_58._0_4_;
      ItemSize(&local_a0,0.0);
      ItemAdd(&local_88,0,(ImRect *)0x0,0);
    }
  }
  return;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}